

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

bool __thiscall IDisk::TrackFormatted(IDisk *this,MFMTrack *track_buffer)

{
  size_type sVar1;
  undefined1 local_40 [8];
  Track track_info;
  MFMTrack *track_buffer_local;
  IDisk *this_local;
  
  if (track_buffer == (MFMTrack *)0x0) {
    this_local._7_1_ = false;
  }
  else if (track_buffer->size == 0) {
    this_local._7_1_ = false;
  }
  else {
    track_info._24_8_ = track_buffer;
    Track::Track((Track *)local_40);
    GetTrackInfo(this,(MFMTrack *)track_info._24_8_,(Track *)local_40);
    sVar1 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::size
                      ((vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)local_40);
    this_local._7_1_ = sVar1 != 0;
    Track::~Track((Track *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool IDisk::TrackFormatted(IDisk::MFMTrack* track_buffer)
{
   // If the pointer is null, it is not
   if (track_buffer == nullptr) return false;
   // If the size is 0, it is not
   if (track_buffer->size == 0) return false;

   // Search the track for any non-weak value
   Track track_info;
   GetTrackInfo(track_buffer, &track_info);
   return (track_info.list_sector_.size() > 0);
}